

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linf.c
# Opt level: O2

int linfget(lindef *lin)

{
  _func_void_lindef_ptr **__ptr;
  char cVar1;
  int iVar2;
  _func_void_lindef_ptr_int *p_Var3;
  long lVar4;
  size_t sVar5;
  byte *pbVar6;
  size_t sVar7;
  
  p_Var3 = (_func_void_lindef_ptr_int *)ftell((FILE *)lin[1].lingetp);
  lin[1].lingotop = p_Var3;
  __ptr = &lin[1].linclsp;
  if ((long)*(int *)&lin[1].linnamp == 0) {
    sVar5 = fread(__ptr,1,0x62,(FILE *)lin[1].lingetp);
  }
  else {
    memmove(__ptr,(void *)((long)*(int *)((long)&lin[1].lingetsp + 4) + (long)__ptr),
            (long)*(int *)&lin[1].linnamp);
    lVar4 = (long)*(int *)&lin[1].linnamp;
    lin[1].lingotop = lin[1].lingotop + -lVar4;
    sVar5 = fread((void *)((long)__ptr + lVar4),1,0x62 - lVar4,(FILE *)lin[1].lingetp);
    sVar5 = (long)*(int *)&lin[1].linnamp + sVar5;
  }
  if (sVar5 == 0) {
    iVar2 = 1;
  }
  else {
    if ((lin->linflg & 2) == 0) {
      lin[1].linfindp = lin[1].linfindp + 1;
    }
    iVar2 = 1;
    *(undefined1 *)((long)&lin[1].linclsp + sVar5) = 0;
    for (pbVar6 = (byte *)((long)&lin[1].linclsp + (long)*(int *)&lin[1].linnamp);
        (ulong)*pbVar6 != 0; pbVar6 = pbVar6 + 1) {
      *pbVar6 = G_cmap_input[*pbVar6];
    }
    for (lVar4 = 0; cVar1 = *(char *)((long)__ptr + lVar4), cVar1 != '\0'; lVar4 = lVar4 + 1) {
      if ((cVar1 == '\n') || (cVar1 == '\r')) {
        if ((lVar4 == 0x61) &&
           (sVar7 = fread((void *)((long)&lin[1].lingetsp + 2),1,1,(FILE *)lin[1].lingetp),
           sVar7 == 1)) {
          sVar5 = sVar5 + 1;
          *(undefined1 *)((long)&lin[1].lingetsp + 3) = 0;
        }
        cVar1 = *(char *)((long)__ptr + lVar4);
        if (cVar1 == '\r') {
          if (*(char *)((long)&lin[1].linclsp + lVar4 + 1) == '\n') {
LAB_00113ec5:
            iVar2 = 2;
          }
        }
        else if (cVar1 == '\n') {
          if (*(char *)((long)&lin[1].linclsp + lVar4 + 1) == '\r') goto LAB_00113ec5;
        }
        else if (cVar1 == '\0') break;
        *(byte *)&lin->linflg = (byte)lin->linflg & 0xfd;
        lin->linlen = (ushort)lVar4;
        *(undefined1 *)((long)&lin[1].linclsp + lVar4) = 0;
        *(int *)((long)&lin[1].lingetsp + 4) = iVar2 + (int)lVar4;
        iVar2 = ((int)sVar5 - iVar2) - (int)lVar4;
        goto LAB_00113ef1;
      }
    }
    *(byte *)&lin->linflg = (byte)lin->linflg | 2;
    lin->linlen = (ushort)sVar5;
    iVar2 = 0;
LAB_00113ef1:
    *(int *)&lin[1].linnamp = iVar2;
    lin->linbuf = (char *)__ptr;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int linfget(lindef *lin)
{
#   define  linf ((linfdef *)lin)
    char   *p;
    size_t  rdlen;
    int     nl_len;

    /* remember seek position of start of current line */
    linf->linfseek = osfpos(linf->linffp);

    /*
     *   if we have data left in the buffer after the end of this line,
     *   move it to the start of the buffer
     */
    if (linf->linfnxtlen != 0)
    {
        /* move the data down */
        memmove(linf->linfbuf, linf->linfbuf + linf->linfbufnxt,
                linf->linfnxtlen);

        /* 
         *   adjust the seek position to account for the fact that we've
         *   read ahead in the file 
         */
        linf->linfseek -= linf->linfnxtlen;

        /* 
         *   Fill up the rest of the buffer.  Leave one byte for a null
         *   terminator and one byte for a possible extra newline pair
         *   character (see below), hence fill to sizeof(buf)-2.  
         */
        rdlen = osfrbc(linf->linffp, linf->linfbuf + linf->linfnxtlen,
                       sizeof(linf->linfbuf) - linf->linfnxtlen - 2);

        /* 
         *   the total space is the amount we had left over plus the
         *   amount we just read 
         */
        rdlen += linf->linfnxtlen;
    }
    else
    {
        /* 
         *   We have nothing in the buffer - fill it up.  Fill to
         *   sizeof(buf)-2 to leave room for a null terminator plus a
         *   possible extra newline pair character (see below). 
         */
        rdlen = osfrbc(linf->linffp, linf->linfbuf,
                       sizeof(linf->linfbuf) - 2);
    }

    /* 
     *   if there's nothing in the buffer at this point, we've reached the
     *   end of the file 
     */
    if (rdlen == 0)
        return TRUE;

    /* 
     *   if the last line was not a continuation line, increment the line
     *   counter for the start of a new line 
     */
    if (!(lin->linflg & LINFMORE))
        ++(linf->linfnum);

    /* null-terminate the buffer contents */
    linf->linfbuf[rdlen] = '\0';

    /* perform character mapping on th new part only */
    for (p = linf->linfbuf + linf->linfnxtlen ; *p != '\0' ; ++p)
        *p = cmap_n2i(*p);

    /* 
     *   scan the for the first newline in the buffer, allowing newline
     *   conventions that involve either CR or LF 
     */
    for (p = linf->linfbuf ; *p != '\n' && *p != '\r' && *p != '\0' ; ++p) ;

    /*
     *   Check to see if this character is followed by its newline pair
     *   complement, to allow for either CR-LF or LF-CR sequences, as well
     *   as plain single-byte newline (CR or LF) sequences.
     *   
     *   First, though, one weird special case: if this character is at
     *   the read limit in the buffer, the complementary character might
     *   be lurking in the next byte that we haven't read.  In this case,
     *   use that one-byte reserve we have left (we filled the buffer only
     *   to length-2 so far) and read the next byte.  
     */
    if (*p != '\0' && p + 1 == linf->linfbuf + sizeof(linf->linfbuf) - 2)
    {
        /* 
         *   we've filled the buffer to but not including the reserve for
         *   just this case - fetch the extra character 
         */
        if (osfrbc(linf->linffp, p + 1, 1) == 1)
        {
            /* increase the total read length for the extra byte */
            ++rdlen;
            *(p+2) = '\0';
        }
    }

    /* 
     *   now we can check for the newline type, since we have definitely
     *   read the full paired sequence 
     */
    if (*p == '\0')
    {
        /* there's no newline in the buffer - we'll return a partial line */
        nl_len = 0;

        /* set the partial line flag */
        lin->linflg |= LINFMORE;

        /* return the entire buffer */
        lin->linlen = rdlen;

        /* there's nothing left for the next time through */
        linf->linfnxtlen = 0;
    }
    else
    {
        /* check for a complementary pair */
        if ((*p == '\n' && *(p+1) == '\r') || (*p == '\r' && *(p+1) == '\n'))
        {
            /* we have a paired newline */
            nl_len = 2;
        }
        else
        {
            /* we have but a single-character newline sequence */
            nl_len = 1;
        }

        /* this is the end of a line */
        lin->linflg &= ~LINFMORE;

        /* 
         *   return only the part of the buffer up to, but not including,
         *   the newline 
         */
        lin->linlen = (p - linf->linfbuf);

        /* null-terminate the buffer at the newline */
        *p = '\0';

        /* 
         *   anything remaining after the newline sequence is available
         *   for reading the next time through 
         */
        linf->linfbufnxt = ((p + nl_len) - linf->linfbuf);
        linf->linfnxtlen = rdlen - linf->linfbufnxt;
    }

    /* make sure buffer pointer is correct */
    lin->linbuf = linf->linfbuf;

    LINFDEBUG(printf("%s\n", linf->linfbuf));

    /* success */
    return FALSE;

#   undef  linf
}